

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O3

t_object * __thiscall
xemmai::t_type_of<xemmai::t_object>::f_derive<xemmai::t_type_of<xemmai::t_module>>
          (t_type_of<xemmai::t_object> *this,t_object *a_module,t_fields *a_fields)

{
  t_type *ptVar1;
  t_queue<128UL> *this_00;
  t_queue<256UL> *this_01;
  t_object *ptVar2;
  long in_FS_OFFSET;
  pair<std::vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>,_std::map<xemmai::t_object_*,_unsigned_long,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>_>
  local_78;
  
  f_merge(&local_78,this,a_fields);
  ptVar2 = t_engine::f_allocate_for_type<xemmai::t_type_of<xemmai::t_module>>
                     (*(t_engine **)(in_FS_OFFSET + -0x60),
                      ((long)local_78.first.
                             super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_78.first.
                             super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  t_type_of<2ul>((t_type_of<xemmai::t_object> *)ptVar2->v_data,
                 &t_bears<xemmai::t_module,_xemmai::t_type_of<xemmai::t_object>_>::c_IDS,this,
                 a_module,0x10,
                 ((long)(a_fields->v_instance).
                        super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(a_fields->v_instance).
                        super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) + this->v_instance_fields,
                 &local_78.first,&local_78.second);
  ptVar2[1].v_cyclic = (size_t)t_type_of<xemmai::t_module>::f_do_scan;
  *(code **)ptVar2[1].v_data = t_type_of<xemmai::t_module>::f_do_instantiate;
  ptVar2[1].v_data[8] = '\0';
  ptVar2[1].v_data[9] = '\0';
  ptVar2[1].v_data[10] = '\0';
  ptVar2[1].v_data[0xb] = '\0';
  ptVar2[1].v_data[0xc] = '\0';
  ptVar2[1].v_data[0xd] = '\0';
  ptVar2[1].v_data[0xe] = '\0';
  ptVar2[1].v_data[0xf] = '\0';
  ptVar2[1].v_rank =
       (size_t)t_finalizes<xemmai::t_bears<xemmai::t_module,_xemmai::t_type_of<xemmai::t_object>_>_>
               ::f_do_finalize;
  ptVar1 = (t_type *)this[-1].f_or;
  this_00 = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
  *this_00->v_head = (t_object *)&ptVar1[-1].f_less;
  if (this_00->v_head == this_00->v_next) {
    t_slot::t_queue<128UL>::f_next(this_00);
  }
  else {
    this_00->v_head = this_00->v_head + 1;
  }
  ptVar2->v_type = ptVar1;
  this_01 = *(t_queue<256UL> **)(in_FS_OFFSET + -0x70);
  *this_01->v_head = ptVar2;
  if (this_01->v_head == this_01->v_next) {
    t_slot::t_queue<256UL>::f_next(this_01);
  }
  else {
    this_01->v_head = this_01->v_head + 1;
  }
  std::
  _Rb_tree<xemmai::t_object_*,_std::pair<xemmai::t_object_*const,_unsigned_long>,_std::_Select1st<std::pair<xemmai::t_object_*const,_unsigned_long>_>,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
  ::~_Rb_tree(&local_78.second._M_t);
  std::
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ::~vector(&local_78.first);
  return ptVar2;
}

Assistant:

t_object* t_type::f_derive(t_object* a_module, const t_fields& a_fields)
{
	auto [fields, key2index] = f_merge(a_fields);
	auto p = f_engine()->f_allocate_for_type<T>(fields.size());
	new(p->f_data()) T(T::c_IDS, this, a_module, T::c_NATIVE, v_instance_fields + a_fields.v_instance.size(), fields, key2index);
	p->f_be(t_object::f_of(this)->v_type);
	return p;
}